

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void __thiscall common_sampler::set_logits(common_sampler *this,llama_context *ctx,int idx)

{
  float fVar1;
  pointer plVar2;
  pointer plVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  float *pfVar7;
  ulong uVar8;
  
  lVar5 = llama_get_logits_ith(ctx,idx);
  uVar6 = llama_get_model(ctx);
  uVar6 = llama_model_get_vocab(uVar6);
  uVar4 = llama_vocab_n_tokens(uVar6);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::resize
            (&this->cur,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    pfVar7 = &((this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
               _M_impl.super__Vector_impl_data._M_start)->p;
    uVar8 = 0;
    do {
      fVar1 = *(float *)(lVar5 + uVar8 * 4);
      ((llama_token_data *)(pfVar7 + -2))->id = (llama_token)uVar8;
      pfVar7[-1] = fVar1;
      *pfVar7 = 0.0;
      uVar8 = uVar8 + 1;
      pfVar7 = pfVar7 + 3;
    } while (uVar4 != uVar8);
  }
  plVar2 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->cur_p).data = plVar2;
  (this->cur_p).size = ((long)plVar3 - (long)plVar2 >> 2) * -0x5555555555555555;
  (this->cur_p).selected = -1;
  (this->cur_p).sorted = false;
  return;
}

Assistant:

void set_logits(struct llama_context * ctx, int idx) {
        const auto * logits = llama_get_logits_ith(ctx, idx);

        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);

        const int n_vocab = llama_vocab_n_tokens(vocab);

        cur.resize(n_vocab);

        for (llama_token token_id = 0; token_id < n_vocab; token_id++) {
            cur[token_id] = llama_token_data{token_id, logits[token_id], 0.0f};
        }

        cur_p = { cur.data(), cur.size(), -1, false };
    }